

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_solution.h
# Opt level: O3

void writeResult(Result *sol,ostream *f)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(f,"Instance: ",10);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (f,(sol->instance)._M_dataplus._M_p,(sol->instance)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," branches: ",0xb);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," time: ",7);
  poVar1 = std::ostream::_M_insert<double>(sol->time);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," MIS size: ",0xb);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," nDefPicks: ",0xc);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," nStratPicks: ",0xe);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," nDefBranchings: ",0x11);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void writeResult(Result& sol, std::ostream &f) {
    f << "Instance: " << sol.instance
      << " branches: " << sol.nBranchings 
      << " time: " << sol.time 
      << " MIS size: " << sol.misSize
      << " nDefPicks: " << sol.nDefaultPicks
      << " nStratPicks: " << sol.nStratPicks
      << " nDefBranchings: " << sol.nDefaultBranchings
      << std::endl;
}